

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O1

ktx_error_code_e ktxTexture2_constructCopy(ktxTexture2 *This,ktxTexture2 *orig)

{
  ktxHashList *pHead;
  size_t sVar1;
  uint uVar2;
  ktxTexture2_private *__src;
  ktx_bool_t kVar3;
  ktxTexture_protected *pkVar4;
  ktxTexture2_private *__dest;
  ktx_uint8_t *pkVar5;
  ktx_uint32_t *__dest_00;
  
  memcpy(This,orig,0xa8);
  This->_protected = (ktxTexture_protected *)0x0;
  This->_private = (ktxTexture2_private *)0x0;
  This->pDfd = (ktx_uint32_t *)0x0;
  This->kvData = (ktx_uint8_t *)0x0;
  This->kvDataHead = (ktxHashList)0x0;
  This->pData = (ktx_uint8_t *)0x0;
  pkVar4 = (ktxTexture_protected *)malloc(0xa8);
  This->_protected = pkVar4;
  if (pkVar4 == (ktxTexture_protected *)0x0) {
    return KTX_OUT_OF_MEMORY;
  }
  if ((orig->pData == (ktx_uint8_t *)0x0) &&
     (kVar3 = ktxTexture_isActiveStream((ktxTexture *)orig), kVar3)) {
    ktxTexture2_loadImageDataInt(orig,(ktx_uint8_t *)0x0,0,LOADDATA_INFLATE_ON_LOAD);
  }
  pHead = &This->kvDataHead;
  memcpy(This->_protected,orig->_protected,0xa8);
  sVar1 = (ulong)(orig->numLevels - 1) * 0x18 + 0x38;
  __dest = (ktxTexture2_private *)malloc(sVar1);
  This->_private = __dest;
  if (__dest != (ktxTexture2_private *)0x0) {
    __src = orig->_private;
    memcpy(__dest,__src,sVar1);
    sVar1 = __src->_sgdByteLength;
    if (sVar1 != 0) {
      pkVar5 = (ktx_uint8_t *)malloc(sVar1);
      __dest->_supercompressionGlobalData = pkVar5;
      if (pkVar5 == (ktx_uint8_t *)0x0) goto LAB_001efa4d;
      memcpy(pkVar5,__src->_supercompressionGlobalData,sVar1);
    }
    __dest_00 = (ktx_uint32_t *)malloc((ulong)*orig->pDfd);
    This->pDfd = __dest_00;
    if (__dest_00 != (ktx_uint32_t *)0x0) {
      memcpy(__dest_00,orig->pDfd,(ulong)*orig->pDfd);
      if (orig->kvDataHead == (ktxHashList)0x0) {
        if (orig->kvData != (ktx_uint8_t *)0x0) {
          uVar2 = orig->kvDataLen;
          pkVar5 = (ktx_uint8_t *)malloc((ulong)uVar2);
          This->kvData = pkVar5;
          if (pkVar5 == (ktx_uint8_t *)0x0) goto LAB_001efa4d;
          memcpy(pkVar5,orig->kvData,(ulong)uVar2);
        }
      }
      else {
        ktxHashList_ConstructCopy(pHead,orig->kvDataHead);
      }
      pkVar5 = (ktx_uint8_t *)malloc(This->dataSize);
      This->pData = pkVar5;
      if (pkVar5 != (ktx_uint8_t *)0x0) {
        memcpy(pkVar5,orig->pData,orig->dataSize);
        return KTX_SUCCESS;
      }
    }
  }
LAB_001efa4d:
  if (This->_protected != (ktxTexture_protected *)0x0) {
    free(This->_protected);
  }
  if (This->_private != (ktxTexture2_private *)0x0) {
    pkVar5 = This->_private->_supercompressionGlobalData;
    if (pkVar5 != (ktx_uint8_t *)0x0) {
      free(pkVar5);
    }
    free(This->_private);
  }
  if (This->pDfd != (ktx_uint32_t *)0x0) {
    free(This->pDfd);
  }
  if (*pHead != (ktxHashList)0x0) {
    ktxHashList_Destruct(pHead);
  }
  return KTX_OUT_OF_MEMORY;
}

Assistant:

KTX_error_code
ktxTexture2_constructCopy(ktxTexture2* This, ktxTexture2* orig)
{
    KTX_error_code result;

    memcpy(This, orig, sizeof(ktxTexture2));
    // Zero all the pointers to make error handling easier
    This->_protected = NULL;
    This->_private = NULL;
    This->pDfd = NULL;
    This->kvData = NULL;
    This->kvDataHead = NULL;
    This->pData = NULL;

    This->_protected =
                    (ktxTexture_protected*)malloc(sizeof(ktxTexture_protected));
    if (!This->_protected)
        return KTX_OUT_OF_MEMORY;
    // Must come before memcpy of _protected so as to close an active stream.
    if (!orig->pData && ktxTexture_isActiveStream((ktxTexture*)orig))
        ktxTexture2_LoadImageData(orig, NULL, 0);
    memcpy(This->_protected, orig->_protected, sizeof(ktxTexture_protected));

    ktx_size_t privateSize = sizeof(ktxTexture2_private)
                           + sizeof(ktxLevelIndexEntry) * (orig->numLevels - 1);
    This->_private = (ktxTexture2_private*)malloc(privateSize);
    if (This->_private == NULL) {
        result = KTX_OUT_OF_MEMORY;
        goto cleanup;
    }
    memcpy(This->_private, orig->_private, privateSize);
    if (orig->_private->_sgdByteLength > 0) {
        This->_private->_supercompressionGlobalData
                        = (ktx_uint8_t*)malloc(orig->_private->_sgdByteLength);
        if (!This->_private->_supercompressionGlobalData) {
            result = KTX_OUT_OF_MEMORY;
            goto cleanup;
        }
        memcpy(This->_private->_supercompressionGlobalData,
               orig->_private->_supercompressionGlobalData,
               orig->_private->_sgdByteLength);
    }

    This->pDfd = (ktx_uint32_t*)malloc(*orig->pDfd);
    if (!This->pDfd) {
        result = KTX_OUT_OF_MEMORY;
        goto cleanup;
    }
    memcpy(This->pDfd, orig->pDfd, *orig->pDfd);

    if (orig->kvDataHead) {
        ktxHashList_ConstructCopy(&This->kvDataHead, orig->kvDataHead);
    } else if (orig->kvData) {
        This->kvData = (ktx_uint8_t*)malloc(orig->kvDataLen);
        if (!This->kvData) {
            result = KTX_OUT_OF_MEMORY;
            goto cleanup;
        }
        memcpy(This->kvData, orig->kvData, orig->kvDataLen);
    }

    // Can't share the image data as the data pointer is exposed in the
    // ktxTexture2 structure. Changing it to a ref-counted pointer would
    // break code. Maybe that's okay as we're still pre-release. But,
    // since this constructor will be mostly be used when transcoding
    // supercompressed images, it is probably not too big a deal to make
    // a copy of the data.
    This->pData = (ktx_uint8_t*)malloc(This->dataSize);
    if (This->pData == NULL) {
        result = KTX_OUT_OF_MEMORY;
        goto cleanup;
    }
    memcpy(This->pData, orig->pData, orig->dataSize);
    return KTX_SUCCESS;

cleanup:
    if (This->_protected) free(This->_protected);
    if (This->_private) {
        if (This->_private->_supercompressionGlobalData)
            free(This->_private->_supercompressionGlobalData);
        free(This->_private);
    }
    if (This->pDfd) free (This->pDfd);
    if (This->kvDataHead) ktxHashList_Destruct(&This->kvDataHead);

    return result;
}